

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O2

void duckdb::TestAllTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference this;
  reference val;
  _func_int **pp_Var2;
  idx_t col_idx;
  ulong __n;
  _func_int **__n_00;
  _func_int **pp_Var3;
  ulong index;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n_00 = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var2 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n_00 < (_func_int **)(((long)pp_Var2 - (long)pp_Var3) / 0x18)) {
    for (index = 0;
        (__n_00 < (_func_int **)(((long)pp_Var2 - (long)pp_Var3) / 0x18) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n_00 + 1);
      this = vector<duckdb::vector<duckdb::Value,_true>,_true>::get<true>
                       ((vector<duckdb::vector<duckdb::Value,_true>,_true> *)(pGVar1 + 1),
                        (size_type)__n_00);
      for (__n = 0; __n < (ulong)((long)(this->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                        .
                                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6);
          __n = __n + 1) {
        val = vector<duckdb::Value,_true>::get<true>(this,__n);
        DataChunk::SetValue(output,__n,index,val);
      }
      __n_00 = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var2 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void TestAllTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<TestAllTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &vals = data.entries[data.offset++];
		for (idx_t col_idx = 0; col_idx < vals.size(); col_idx++) {
			output.SetValue(col_idx, count, vals[col_idx]);
		}
		count++;
	}
	output.SetCardinality(count);
}